

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

void mbedtls_asn1_sequence_free(mbedtls_asn1_sequence *seq)

{
  mbedtls_asn1_sequence *pmVar1;
  mbedtls_asn1_sequence *next;
  mbedtls_asn1_sequence *seq_local;
  
  next = seq;
  while (next != (mbedtls_asn1_sequence *)0x0) {
    pmVar1 = next->next;
    mbedtls_platform_zeroize(next,0x20);
    free(next);
    next = pmVar1;
  }
  return;
}

Assistant:

void mbedtls_asn1_sequence_free( mbedtls_asn1_sequence *seq )
{
    while( seq != NULL )
    {
        mbedtls_asn1_sequence *next = seq->next;
        mbedtls_platform_zeroize( seq, sizeof( *seq ) );
        mbedtls_free( seq );
        seq = next;
    }
}